

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O3

void __thiscall
ktx::Reporter::fatal<char_const(&)[44],std::__cxx11::string,std::__cxx11::string>
          (Reporter *this,ReturnCode return_code,char (*args) [44],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  char *pcVar1;
  undefined8 *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  format_string<std::__cxx11::basic_string<char>_&> fmt;
  format_string<std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_> fmt_00;
  format_string<> fmt_01;
  
  args_00 = args_2;
  pcVar1 = (char *)std::char_traits<char>::length("{} fatal: ");
  fmt.str_.size_ = (size_t)this;
  fmt.str_.data_ = pcVar1;
  ::fmt::v10::print<std::__cxx11::string&>((v10 *)&std::cerr,(ostream *)"{} fatal: ",fmt,args_00);
  pcVar1 = (char *)std::char_traits<char>::length(*args);
  fmt_00.str_.size_ = (size_t)args_1;
  fmt_00.str_.data_ = pcVar1;
  ::fmt::v10::print<std::__cxx11::string,std::__cxx11::string>
            ((v10 *)&std::cerr,(ostream *)args,fmt_00,args_2,in_R9);
  pcVar1 = (char *)std::char_traits<char>::length("\n");
  fmt_01.str_.size_ = (size_t)args_1;
  fmt_01.str_.data_ = pcVar1;
  ::fmt::v10::print<>((v10 *)&std::cerr,(ostream *)0x1fcdf2,fmt_01);
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar2 = &PTR__exception_0025b838;
  *(ReturnCode *)(puVar2 + 1) = return_code;
  __cxa_throw(puVar2,&FatalError::typeinfo,std::exception::~exception);
}

Assistant:

void fatal(ReturnCode return_code, Args&&... args) {
        fmt::print(std::cerr, "{} fatal: ", commandName);
        fmt::print(std::cerr, std::forward<Args>(args)...);
        fmt::print(std::cerr, "\n");
        throw FatalError(return_code);
    }